

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O1

void __thiscall
boost::shared_ptr<boost::exception_detail::clone_base_const>::
shared_ptr<boost::exception_detail::clone_impl<boost::exception_detail::bad_alloc_>>
          (shared_ptr<boost::exception_detail::clone_base_const> *this,
          clone_impl<boost::exception_detail::bad_alloc_> *p)

{
  sp_counted_base *psVar1;
  sp_counted_base *in_RAX;
  _func_int *p_Var2;
  shared_count local_18;
  
  if (p == (clone_impl<boost::exception_detail::bad_alloc_> *)0x0) {
    p_Var2 = (_func_int *)0x0;
  }
  else {
    p_Var2 = (_func_int *)
             ((long)&(p->super_bad_alloc_).super_exception._vptr_exception +
             (long)(p->super_bad_alloc_).super_exception._vptr_exception[-3]);
  }
  *(_func_int **)this = p_Var2;
  *(undefined8 *)(this + 8) = 0;
  local_18.pi_ = in_RAX;
  detail::shared_count::
  shared_count<boost::exception_detail::clone_impl<boost::exception_detail::bad_alloc_>>
            (&local_18,p);
  psVar1 = *(sp_counted_base **)(this + 8);
  *(sp_counted_base **)(this + 8) = local_18.pi_;
  local_18.pi_ = psVar1;
  detail::shared_count::~shared_count(&local_18);
  return;
}

Assistant:

explicit shared_ptr( Y * p ): px( p ), pn() // Y must be complete
    {
        boost::detail::sp_pointer_construct( this, p, pn );
    }